

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double * marsaglia_generate(double *values,int N,double average,double deviation)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool local_56;
  bool local_55;
  double f;
  double rsq;
  double y;
  double x;
  int M;
  int i;
  double deviation_local;
  double average_local;
  int N_local;
  double *values_local;
  
  for (x._4_4_ = 0; x._4_4_ < N + -1; x._4_4_ = x._4_4_ + 2) {
    do {
      iVar1 = rand();
      dVar2 = ((double)iVar1 * 2.0) / 2147483647.0 - 1.0;
      iVar1 = rand();
      dVar3 = ((double)iVar1 * 2.0) / 2147483647.0 - 1.0;
      dVar4 = dVar2 * dVar2 + dVar3 * dVar3;
      local_55 = 1.0 <= dVar4 || dVar4 == 0.0;
    } while (local_55);
    dVar5 = log(dVar4);
    dVar4 = sqrt((dVar5 * -2.0) / dVar4);
    values[x._4_4_] = dVar2 * dVar4;
    values[x._4_4_ + 1] = dVar3 * dVar4;
  }
  if (N + N % 2 != N) {
    do {
      iVar1 = rand();
      dVar2 = ((double)iVar1 * 2.0) / 2147483647.0 - 1.0;
      iVar1 = rand();
      dVar3 = ((double)iVar1 * 2.0) / 2147483647.0 - 1.0;
      dVar3 = dVar2 * dVar2 + dVar3 * dVar3;
      local_56 = 1.0 <= dVar3 || dVar3 == 0.0;
    } while (local_56);
    dVar4 = log(dVar3);
    dVar3 = sqrt((dVar4 * -2.0) / dVar3);
    values[N + -1] = dVar2 * dVar3;
  }
  for (x._4_4_ = 0; x._4_4_ < N; x._4_4_ = x._4_4_ + 1) {
    values[x._4_4_] = values[x._4_4_] * deviation + average;
  }
  return values;
}

Assistant:

double* marsaglia_generate(double *values, int N, double average, double  deviation)
{
	int i;
	int M;
	double x, y, rsq, f;

	M = N + N % 2;



	for (i = 0; i < N - 1; i += 2)
	{
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[i] = x * f;
		values[i + 1] = y * f;
	}

	if (M != N) {
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[N - 1] = x * f;
	}


	for (i = 0; i < N; ++i) {
		values[i] = (values[i] * deviation + average);
	}
	return values;
}